

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O1

ntuple_list
LineSegmentDetection
          (image_double image,double scale,double sigma_scale,double quant,double ang_th,double eps,
          double density_th,int n_bins,double max_grad,image_int *region)

{
  double dVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  image_double piVar8;
  image_int piVar9;
  image_char used;
  image_double piVar10;
  ntuple_list pnVar11;
  void *pvVar12;
  void *__s;
  int iVar13;
  uint uVar14;
  uint uVar15;
  rect *in_RCX;
  ulong uVar16;
  long *plVar17;
  ntuple_list pnVar18;
  int iVar19;
  int iVar20;
  undefined8 *extraout_RDX;
  void *pvVar21;
  long lVar22;
  image_double angles;
  long *extraout_RDX_00;
  uint uVar23;
  long lVar24;
  int iVar25;
  undefined4 in_register_00000034;
  long *plVar26;
  long *plVar27;
  ulong uVar28;
  image_double piVar29;
  uint *in_R8;
  uint *reg_size_00;
  rect *in_R9;
  uint uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  ulong uVar35;
  undefined4 uVar36;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar37;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar38;
  double dVar39;
  rect *prVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  undefined8 in_XMM1_Qb;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  rect *prVar49;
  double *pdVar50;
  double *pdVar51;
  double dVar52;
  double dVar53;
  int reg_size;
  rect rec;
  coorlist *list_p;
  image_double modgrad;
  double reg_angle;
  void *mem_p;
  double dStackY_368;
  double dStackY_358;
  long *plStackY_308;
  ulong uStackY_2e8;
  uint local_23c;
  rect *local_238;
  undefined8 uStack_230;
  rect *local_228;
  double local_220;
  double local_218;
  ntuple_list local_210;
  double *local_208;
  rect *local_200;
  rect local_1f8;
  undefined1 local_198 [16];
  rect *local_180;
  ulong local_178;
  rect local_170;
  image_double local_110;
  double *local_108;
  int local_100;
  uint local_fc;
  double local_f8;
  rect *local_f0;
  ulong local_e8;
  image_int *local_e0;
  rect *local_d8;
  double local_d0;
  ulong local_c8;
  image_double local_c0;
  image_double local_b8;
  coorlist *local_b0;
  undefined1 local_a8 [88];
  void *local_50;
  double local_48;
  undefined8 uStack_40;
  
  plVar26 = (long *)CONCAT44(in_register_00000034,n_bins);
  reg_size_00 = (uint *)(ulong)(uint)n_bins;
  piVar29 = (image_double)0x5;
  local_238 = (rect *)sigma_scale;
  uStack_230 = in_XMM1_Qb;
  local_200 = (rect *)scale;
  local_180 = (rect *)ang_th;
  local_f8 = eps;
  local_f0 = (rect *)density_th;
  local_e0 = region;
  local_d8 = (rect *)quant;
  local_a8._8_8_ = max_grad;
  local_a8._72_8_ = new_ntuple_list(5);
  if ((((image == (image_double)0x0) || (image->data == (double *)0x0)) || (image->xsize == 0)) ||
     (image->ysize == 0)) {
    LineSegmentDetection();
LAB_00105dc8:
    LineSegmentDetection();
LAB_00105dcd:
    LineSegmentDetection();
LAB_00105dd2:
    LineSegmentDetection();
    goto LAB_00105dd7;
  }
  if ((double)local_200 <= 0.0) {
LAB_00105de1:
    LineSegmentDetection();
LAB_00105de6:
    LineSegmentDetection();
LAB_00105deb:
    LineSegmentDetection();
LAB_00105df0:
    LineSegmentDetection();
LAB_00105df5:
    LineSegmentDetection();
LAB_00105dfa:
    LineSegmentDetection();
LAB_00105dff:
    reg_size_00 = in_R8;
    LineSegmentDetection();
LAB_00105e04:
    LineSegmentDetection();
LAB_00105e09:
    LineSegmentDetection();
  }
  else {
    sigma_scale = (double)local_d8;
    if ((double)local_238 <= 0.0) goto LAB_00105de6;
    if ((double)local_d8 < 0.0) goto LAB_00105deb;
    sigma_scale = (double)local_180;
    if (((double)local_180 <= 0.0) || (180.0 <= (double)local_180)) goto LAB_00105df0;
    sigma_scale = (double)local_f0;
    if (((double)local_f0 < 0.0) || (1.0 < (double)local_f0)) goto LAB_00105df5;
    if (n_bins < 1) goto LAB_00105dfa;
    if ((double)local_a8._8_8_ <= 0.0) goto LAB_00105dff;
    local_228 = (rect *)(((double)local_180 * 3.141592653589793) / 180.0);
    dVar38 = sin((double)local_228);
    sigma_scale = (double)local_d8 / dVar38;
    if (((double)local_200 == 1.0) && (!NAN((double)local_200))) {
      in_RCX = (rect *)local_a8;
      prVar49 = (rect *)local_a8._8_8_;
      piVar8 = ll_angle(image,sigma_scale,&local_b0,&local_50,(image_double *)in_RCX,n_bins,
                        (double)local_a8._8_8_);
      sigma_scale = (double)prVar49;
LAB_00104cdb:
      local_180 = (rect *)((double)local_180 / 180.0);
      uVar23 = piVar8->xsize;
      uVar33 = piVar8->ysize;
      dVar38 = log10((double)uVar23);
      local_198._8_4_ = extraout_XMM0_Dc_01;
      local_198._0_8_ = dVar38;
      local_198._12_4_ = extraout_XMM0_Dd_01;
      local_208 = (double *)log10((double)uVar33);
      local_238 = (rect *)log10((double)local_180);
      if (local_e0 != (image_int *)0x0) {
        uVar4 = piVar8->xsize;
        uVar15 = piVar8->ysize;
        piVar9 = new_image_int(uVar4,uVar15);
        uVar15 = uVar15 * uVar4;
        if (uVar15 != 0) {
          memset(piVar9->data,0,(ulong)uVar15 << 2);
        }
        *local_e0 = piVar9;
      }
      used = new_image_char_ini(uVar23,uVar33,'\0');
      piVar29 = (image_double)(ulong)(uVar33 * uVar23);
      plVar26 = (long *)0x8;
      piVar10 = (image_double)calloc((size_t)piVar29,8);
      if (piVar10 != (image_double)0x0) {
        if (local_b0 != (coorlist *)0x0) {
          local_198._0_8_ = ((double)local_198._0_8_ + (double)local_208) * 5.0 * 0.5;
          uVar23 = (uint)(-(double)local_198._0_8_ / (double)local_238);
          uVar28 = (ulong)uVar23;
          uVar35 = 0;
          local_210 = (ntuple_list)CONCAT44(local_210._4_4_,uVar23);
          prVar49 = local_228;
          do {
            iVar34 = local_b0->x;
            iVar20 = local_b0->y;
            if ((used->data[used->xsize * iVar20 + iVar34] == '\0') &&
               ((piVar8->data[piVar8->xsize * iVar20 + iVar34] != -1024.0 ||
                (NAN(piVar8->data[piVar8->xsize * iVar20 + iVar34]))))) {
              in_R8 = &local_23c;
              in_R9 = (rect *)(local_a8 + 0x50);
              region_grow(iVar34,iVar20,piVar8,(point *)piVar10,(int *)in_R8,(double *)in_R9,used,
                          (double)prVar49);
              plVar26 = (long *)(ulong)local_23c;
              prVar49 = local_228;
              if ((int)uVar28 <= (int)local_23c) {
                in_RCX = &local_1f8;
                piVar29 = piVar10;
                quant = (double)local_180;
                sigma_scale = (double)local_228;
                region2rect((point *)piVar10,local_23c,(image_double)local_a8._0_8_,
                            (double)local_a8._80_8_,(double)local_228,(double)local_180,in_RCX);
                local_110 = (image_double)local_a8._0_8_;
                local_170.x1 = (double)local_a8._80_8_;
                if ((double)local_228 < 0.0) goto LAB_00105dd2;
                if (used->data == (uchar *)0x0) goto LAB_00105dcd;
                if (piVar8->data == (double *)0x0) goto LAB_00105dc8;
                dVar38 = (local_1f8.x2 - local_1f8.x1) * (local_1f8.x2 - local_1f8.x1) +
                         (local_1f8.y2 - local_1f8.y1) * (local_1f8.y2 - local_1f8.y1);
                local_178 = uVar35;
                if (dVar38 < 0.0) {
                  local_238 = (rect *)(double)(int)local_23c;
                  dVar38 = sqrt(dVar38);
                  prVar49 = local_238;
                }
                else {
                  dVar38 = SQRT(dVar38);
                  prVar49 = (rect *)(double)(int)local_23c;
                }
                if ((double)prVar49 / (dVar38 * local_1f8.width) < (double)local_f0) {
                  if ((int)local_23c < 1) {
                    pdVar50 = (double *)0x0;
                    prVar49 = (rect *)0x0;
                    dVar38 = 0.0;
                  }
                  else {
                    dVar38 = (double)*(int *)&piVar10->data;
                    iVar34 = *(int *)((long)&piVar10->data + 4);
                    pdVar51 = (double *)(double)iVar34;
                    local_220 = piVar8->data[iVar34 * piVar8->xsize + *(int *)&piVar10->data];
                    prVar49 = (rect *)0x0;
                    lVar24 = 0;
                    iVar34 = 0;
                    pdVar50 = (double *)0x0;
                    local_218 = dVar38;
                    local_108 = pdVar51;
                    do {
                      used->data
                      [used->xsize * *(int *)((long)&piVar10->data + lVar24 * 8 + 4) +
                       *(int *)(&piVar10->data + lVar24)] = '\0';
                      dVar46 = (double)*(int *)(&piVar10->data + lVar24) - dVar38;
                      dVar39 = (double)*(int *)((long)&piVar10->data + lVar24 * 8 + 4) -
                               (double)pdVar51;
                      dVar46 = dVar46 * dVar46 + dVar39 * dVar39;
                      if (dVar46 < 0.0) {
                        local_238 = prVar49;
                        local_208 = pdVar50;
                        dVar46 = sqrt(dVar46);
                        prVar49 = local_238;
                        pdVar50 = local_208;
                        dVar38 = local_218;
                        pdVar51 = local_108;
                      }
                      else {
                        dVar46 = SQRT(dVar46);
                      }
                      if (dVar46 < local_1f8.width) {
                        for (dVar46 = piVar8->data
                                      [piVar8->xsize *
                                       *(int *)((long)&piVar10->data + lVar24 * 8 + 4) +
                                       *(int *)(&piVar10->data + lVar24)] - local_220;
                            dVar46 <= -3.141592653589793; dVar46 = dVar46 + 6.28318530718) {
                        }
                        for (; 3.141592653589793 < dVar46; dVar46 = dVar46 + -6.28318530718) {
                        }
                        pdVar50 = (double *)((double)pdVar50 + dVar46);
                        prVar49 = (rect *)((double)prVar49 + dVar46 * dVar46);
                        iVar34 = iVar34 + 1;
                      }
                      lVar24 = lVar24 + 1;
                    } while (lVar24 < (int)local_23c);
                    dVar38 = (double)iVar34;
                    uVar28 = (ulong)local_210 & 0xffffffff;
                  }
                  uVar35 = local_178;
                  dVar46 = (double)pdVar50 / dVar38;
                  dVar38 = dVar46 * dVar46 +
                           (dVar46 * -2.0 * (double)pdVar50 + (double)prVar49) / dVar38;
                  if (dVar38 < 0.0) {
                    dVar38 = sqrt(dVar38);
                  }
                  else {
                    dVar38 = SQRT(dVar38);
                  }
                  reg_size_00 = &local_23c;
                  in_R9 = &local_170;
                  region_grow(*(int *)&piVar10->data,*(int *)((long)&piVar10->data + 4),piVar8,
                              (point *)piVar10,(int *)reg_size_00,&local_170.x1,used,dVar38 + dVar38
                             );
                  plVar26 = (long *)(ulong)local_23c;
                  prVar49 = local_228;
                  if ((int)local_23c < 2) goto LAB_00104e28;
                  in_RCX = &local_1f8;
                  piVar29 = piVar10;
                  region2rect((point *)piVar10,local_23c,local_110,local_170.x1,(double)local_228,
                              (double)local_180,in_RCX);
                  sigma_scale = (local_1f8.y2 - local_1f8.y1) * (local_1f8.y2 - local_1f8.y1);
                  dVar38 = (local_1f8.x2 - local_1f8.x1) * (local_1f8.x2 - local_1f8.x1) +
                           sigma_scale;
                  if (dVar38 < 0.0) {
                    local_238 = (rect *)(double)(int)local_23c;
                    dVar38 = sqrt(dVar38);
                    prVar49 = local_238;
                  }
                  else {
                    dVar38 = SQRT(dVar38);
                    prVar49 = (rect *)(double)(int)local_23c;
                  }
                  quant = (double)prVar49 / (dVar38 * local_1f8.width);
                  if (quant < (double)local_f0) {
                    if (used->data == (uchar *)0x0) goto LAB_00105e13;
                    if (piVar8->data == (double *)0x0) goto LAB_00105e18;
                    local_108 = (double *)local_170.x1;
                    dVar38 = (local_1f8.x2 - local_1f8.x1) * (local_1f8.x2 - local_1f8.x1) +
                             (local_1f8.y2 - local_1f8.y1) * (local_1f8.y2 - local_1f8.y1);
                    if (dVar38 < 0.0) {
                      local_220 = (double)(int)local_23c;
                      dVar38 = sqrt(dVar38);
                      dVar46 = local_220;
                    }
                    else {
                      dVar38 = SQRT(dVar38);
                      dVar46 = (double)(int)local_23c;
                    }
                    dVar46 = dVar46 / (dVar38 * local_1f8.width);
                    if (dVar46 < (double)local_f0) {
                      local_238 = (rect *)(double)*(int *)&piVar10->data;
                      local_208 = (double *)(double)*(int *)((long)&piVar10->data + 4);
                      dVar38 = (local_1f8.x1 - (double)local_238) *
                               (local_1f8.x1 - (double)local_238) +
                               (local_1f8.y1 - (double)local_208) *
                               (local_1f8.y1 - (double)local_208);
                      local_220 = dVar46;
                      if (dVar38 < 0.0) {
                        dVar38 = sqrt(dVar38);
                      }
                      else {
                        dVar38 = SQRT(dVar38);
                      }
                      dVar46 = (local_1f8.x2 - (double)local_238) *
                               (local_1f8.x2 - (double)local_238) +
                               (local_1f8.y2 - (double)local_208) *
                               (local_1f8.y2 - (double)local_208);
                      if (dVar46 < 0.0) {
                        local_218 = dVar38;
                        dVar46 = sqrt(dVar46);
                        dVar38 = local_218;
                      }
                      else {
                        dVar46 = SQRT(dVar46);
                      }
                      if (local_220 < (double)local_f0) {
                        local_218 = dVar38;
                        if (dVar38 <= dVar46) {
                          local_218 = dVar46;
                        }
                        do {
                          dVar38 = local_218 * 0.75;
                          prVar49 = local_228;
                          local_218 = dVar38;
                          if (0 < (int)local_23c) {
                            iVar34 = 0;
                            do {
                              lVar24 = (long)iVar34;
                              dVar46 = (double)*(int *)(&piVar10->data + lVar24) - (double)local_238
                              ;
                              dVar39 = (double)*(int *)((long)&piVar10->data + lVar24 * 8 + 4) -
                                       (double)local_208;
                              dVar46 = dVar46 * dVar46 + dVar39 * dVar39;
                              if (dVar46 < 0.0) {
                                dVar46 = sqrt(dVar46);
                                prVar49 = local_228;
                                dVar38 = local_218;
                              }
                              else {
                                dVar46 = SQRT(dVar46);
                              }
                              if (dVar38 < dVar46) {
                                used->data
                                [used->xsize * *(int *)((long)&piVar10->data + lVar24 * 8 + 4) +
                                 *(int *)(&piVar10->data + lVar24)] = '\0';
                                *(int *)(&piVar10->data + lVar24) =
                                     *(int *)((long)piVar10 + (long)(int)local_23c * 8 + -8);
                                *(undefined4 *)((long)&piVar10->data + lVar24 * 8 + 4) =
                                     *(undefined4 *)((long)piVar10 + (long)(int)local_23c * 8 + -4);
                                local_23c = local_23c - 1;
                                iVar34 = iVar34 + -1;
                              }
                              iVar34 = iVar34 + 1;
                            } while (iVar34 < (int)local_23c);
                          }
                          uVar28 = (ulong)local_210 & 0xffffffff;
                          uVar35 = local_178;
                          if ((int)local_23c < 2) goto LAB_00104e28;
                          region2rect((point *)piVar10,local_23c,local_110,(double)local_108,
                                      (double)prVar49,(double)local_180,&local_1f8);
                          dVar38 = (local_1f8.x2 - local_1f8.x1) * (local_1f8.x2 - local_1f8.x1) +
                                   (local_1f8.y2 - local_1f8.y1) * (local_1f8.y2 - local_1f8.y1);
                          if (dVar38 < 0.0) {
                            local_220 = (double)(int)local_23c;
                            dVar38 = sqrt(dVar38);
                            dVar46 = local_220;
                          }
                          else {
                            dVar38 = SQRT(dVar38);
                            dVar46 = (double)(int)local_23c;
                          }
                        } while (dVar46 / (dVar38 * local_1f8.width) < (double)local_f0);
                      }
                    }
                  }
                }
                local_238 = (rect *)rect_nfa(&local_1f8,piVar8,(double)local_198._0_8_);
                if ((double)local_238 <= local_f8) {
                  local_170.x1 = local_1f8.x1;
                  local_170.y1 = local_1f8.y1;
                  local_170.x2 = local_1f8.x2;
                  local_170.y2 = local_1f8.y2;
                  local_170.width = local_1f8.width;
                  local_170.x = local_1f8.x;
                  local_170.y = local_1f8.y;
                  local_170.theta = local_1f8.theta;
                  local_170.dx = local_1f8.dx;
                  local_170.dy = local_1f8.dy;
                  local_170.p = local_1f8.p;
                  iVar34 = 5;
                  do {
                    local_170.p = local_170.p * 0.5;
                    local_170.prec = local_170.p * 3.141592653589793;
                    prVar49 = (rect *)rect_nfa(&local_170,piVar8,(double)local_198._0_8_);
                    if ((double)local_238 < (double)prVar49) {
                      local_1f8.x1 = local_170.x1;
                      local_1f8.y1 = local_170.y1;
                      local_1f8.x2 = local_170.x2;
                      local_1f8.y2 = local_170.y2;
                      local_1f8.width = local_170.width;
                      local_1f8.x = local_170.x;
                      local_1f8.y = local_170.y;
                      local_1f8.theta = local_170.theta;
                      local_1f8.dx = local_170.dx;
                      local_1f8.dy = local_170.dy;
                      local_1f8.prec = local_170.prec;
                      local_1f8.p = local_170.p;
                      local_238 = prVar49;
                    }
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                  if ((double)local_238 <= local_f8) {
                    local_170.x1 = local_1f8.x1;
                    local_170.y1 = local_1f8.y1;
                    local_170.x2 = local_1f8.x2;
                    local_170.y2 = local_1f8.y2;
                    local_170.width = local_1f8.width;
                    local_170.x = local_1f8.x;
                    local_170.y = local_1f8.y;
                    local_170.theta = local_1f8.theta;
                    local_170.dx = local_1f8.dx;
                    local_170.dy = local_1f8.dy;
                    local_170.prec = local_1f8.prec;
                    local_170.p = local_1f8.p;
                    iVar34 = 5;
                    do {
                      if (0.5 <= local_170.width + -0.5) {
                        local_170.width = local_170.width + -0.5;
                        prVar49 = (rect *)rect_nfa(&local_170,piVar8,(double)local_198._0_8_);
                        if ((double)local_238 < (double)prVar49) {
                          local_1f8.x1 = local_170.x1;
                          local_1f8.y1 = local_170.y1;
                          local_1f8.x2 = local_170.x2;
                          local_1f8.y2 = local_170.y2;
                          local_1f8.width = local_170.width;
                          local_1f8.x = local_170.x;
                          local_1f8.y = local_170.y;
                          local_1f8.theta = local_170.theta;
                          local_1f8.dx = local_170.dx;
                          local_1f8.dy = local_170.dy;
                          local_1f8.prec = local_170.prec;
                          local_1f8.p = local_170.p;
                          local_238 = prVar49;
                        }
                      }
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                    if ((double)local_238 <= local_f8) {
                      local_170.x1 = local_1f8.x1;
                      local_170.y1 = local_1f8.y1;
                      local_170.x2 = local_1f8.x2;
                      local_170.y2 = local_1f8.y2;
                      local_170.width = local_1f8.width;
                      local_170.x = local_1f8.x;
                      local_170.y = local_1f8.y;
                      local_170.theta = local_1f8.theta;
                      local_170.dx = local_1f8.dx;
                      local_170.dy = local_1f8.dy;
                      local_170.prec = local_1f8.prec;
                      local_170.p = local_1f8.p;
                      iVar34 = 5;
                      do {
                        if (0.5 <= local_170.width + -0.5) {
                          local_170.x1 = local_170.x1 + -local_170.dy * 0.25;
                          local_170.y1 = local_170.y1 + local_170.dx * 0.25;
                          local_170.x2 = -local_170.dy * 0.25 + local_170.x2;
                          local_170.y2 = local_170.dx * 0.25 + local_170.y2;
                          local_170.width = local_170.width + -0.5;
                          prVar49 = (rect *)rect_nfa(&local_170,piVar8,(double)local_198._0_8_);
                          if ((double)local_238 < (double)prVar49) {
                            local_1f8.x1 = local_170.x1;
                            local_1f8.y1 = local_170.y1;
                            local_1f8.x2 = local_170.x2;
                            local_1f8.y2 = local_170.y2;
                            local_1f8.width = local_170.width;
                            local_1f8.x = local_170.x;
                            local_1f8.y = local_170.y;
                            local_1f8.theta = local_170.theta;
                            local_1f8.dx = local_170.dx;
                            local_1f8.dy = local_170.dy;
                            local_1f8.prec = local_170.prec;
                            local_1f8.p = local_170.p;
                            local_238 = prVar49;
                          }
                        }
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                      if ((double)local_238 <= local_f8) {
                        local_170.x1 = local_1f8.x1;
                        local_170.y1 = local_1f8.y1;
                        local_170.x2 = local_1f8.x2;
                        local_170.y2 = local_1f8.y2;
                        local_170.width = local_1f8.width;
                        local_170.x = local_1f8.x;
                        local_170.y = local_1f8.y;
                        local_170.theta = local_1f8.theta;
                        local_170.dx = local_1f8.dx;
                        local_170.dy = local_1f8.dy;
                        local_170.prec = local_1f8.prec;
                        local_170.p = local_1f8.p;
                        iVar34 = 5;
                        do {
                          if (0.5 <= local_170.width + -0.5) {
                            local_170.x1 = local_170.x1 + local_170.dy * 0.25;
                            local_170.y1 = local_170.y1 + -local_170.dx * 0.25;
                            local_170.x2 = local_170.dy * 0.25 + local_170.x2;
                            local_170.y2 = -local_170.dx * 0.25 + local_170.y2;
                            local_170.width = local_170.width + -0.5;
                            prVar49 = (rect *)rect_nfa(&local_170,piVar8,(double)local_198._0_8_);
                            if ((double)local_238 < (double)prVar49) {
                              local_1f8.x1 = local_170.x1;
                              local_1f8.y1 = local_170.y1;
                              local_1f8.x2 = local_170.x2;
                              local_1f8.y2 = local_170.y2;
                              local_1f8.width = local_170.width;
                              local_1f8.x = local_170.x;
                              local_1f8.y = local_170.y;
                              local_1f8.theta = local_170.theta;
                              local_1f8.dx = local_170.dx;
                              local_1f8.dy = local_170.dy;
                              local_1f8.prec = local_170.prec;
                              local_1f8.p = local_170.p;
                              local_238 = prVar49;
                            }
                          }
                          iVar34 = iVar34 + -1;
                        } while (iVar34 != 0);
                        if ((double)local_238 <= local_f8) {
                          local_170.x1 = local_1f8.x1;
                          local_170.y1 = local_1f8.y1;
                          local_170.x2 = local_1f8.x2;
                          local_170.y2 = local_1f8.y2;
                          local_170.width = local_1f8.width;
                          local_170.x = local_1f8.x;
                          local_170.y = local_1f8.y;
                          local_170.theta = local_1f8.theta;
                          local_170.dx = local_1f8.dx;
                          local_170.dy = local_1f8.dy;
                          local_170.p = local_1f8.p;
                          iVar34 = 5;
                          do {
                            local_170.p = local_170.p * 0.5;
                            local_170.prec = local_170.p * 3.141592653589793;
                            prVar49 = (rect *)rect_nfa(&local_170,piVar8,(double)local_198._0_8_);
                            if ((double)local_238 < (double)prVar49) {
                              local_1f8.x1 = local_170.x1;
                              local_1f8.y1 = local_170.y1;
                              local_1f8.x2 = local_170.x2;
                              local_1f8.y2 = local_170.y2;
                              local_1f8.width = local_170.width;
                              local_1f8.x = local_170.x;
                              local_1f8.y = local_170.y;
                              local_1f8.theta = local_170.theta;
                              local_1f8.dx = local_170.dx;
                              local_1f8.dy = local_170.dy;
                              local_1f8.prec = local_170.prec;
                              local_1f8.p = local_170.p;
                              local_238 = prVar49;
                            }
                            iVar34 = iVar34 + -1;
                          } while (iVar34 != 0);
                        }
                      }
                    }
                  }
                }
                uVar35 = local_178;
                prVar49 = local_228;
                if (local_f8 < (double)local_238) {
                  local_1f8.x1 = local_1f8.x1 + 0.5;
                  local_1f8.y1 = local_1f8.y1 + 0.5;
                  local_1f8.x2 = local_1f8.x2 + 0.5;
                  local_1f8.y2 = local_1f8.y2 + 0.5;
                  if (((double)local_200 != 1.0) || (NAN((double)local_200))) {
                    local_1f8.x1 = local_1f8.x1 / (double)local_200;
                    local_1f8.y1 = local_1f8.y1 / (double)local_200;
                    local_1f8.x2 = local_1f8.x2 / (double)local_200;
                    local_1f8.y2 = local_1f8.y2 / (double)local_200;
                    local_1f8.width = local_1f8.width / (double)local_200;
                  }
                  uVar23 = (int)local_178 + 1;
                  uVar35 = (ulong)uVar23;
                  add_5tuple((ntuple_list)local_a8._72_8_,local_1f8.x1,local_1f8.y1,local_1f8.x2,
                             local_1f8.y2,local_1f8.width);
                  prVar49 = local_228;
                  if ((local_e0 != (image_int *)0x0) && (0 < (int)local_23c)) {
                    piVar9 = *local_e0;
                    piVar2 = piVar9->data;
                    lVar24 = 0;
                    do {
                      piVar2[piVar9->xsize * *(int *)((long)&piVar10->data + lVar24 * 8 + 4) +
                             *(int *)(&piVar10->data + lVar24)] = uVar23;
                      lVar24 = lVar24 + 1;
                    } while (lVar24 < (int)local_23c);
                  }
                }
              }
            }
LAB_00104e28:
            local_b0 = local_b0->next;
          } while (local_b0 != (coorlist *)0x0);
          local_b0 = (coorlist *)0x0;
        }
        free_image_double(piVar8);
        free_image_double((image_double)local_a8._0_8_);
        free_image_char(used);
        free(piVar10);
        free(local_50);
        return (ntuple_list)local_a8._72_8_;
      }
      goto LAB_00105e04;
    }
    if ((image->data == (double *)0x0) || (image->xsize == 0)) {
LAB_00105dd7:
      LineSegmentDetection();
      prVar49 = (rect *)sigma_scale;
LAB_00105ddc:
      LineSegmentDetection();
      sigma_scale = (double)prVar49;
      goto LAB_00105de1;
    }
    uVar23 = image->ysize;
    if (uVar23 == 0) goto LAB_00105dd7;
    reg_size_00 = in_R8;
    if ((double)local_200 <= 0.0) goto LAB_00105e09;
    if (0.0 < (double)local_238) {
      dVar38 = (double)image->xsize * (double)local_200;
      prVar49 = local_200;
      local_d8 = (rect *)sigma_scale;
      local_a8._68_4_ = n_bins;
      if (dVar38 <= 4294967295.0) {
        quant = (double)uVar23 * (double)local_200;
        local_198._0_8_ = quant;
        if (quant <= 4294967295.0) {
          dVar38 = floor(dVar38);
          dVar46 = floor((double)local_198._0_8_);
          piVar29 = new_image_double((uint)(long)dVar38,uVar23);
          local_c0 = new_image_double((uint)(long)dVar38,(uint)(long)dVar46);
          local_48 = (double)(~-(ulong)((double)local_200 < 1.0) & (ulong)local_238 |
                             (ulong)((double)local_238 / (double)local_200) &
                             -(ulong)((double)local_200 < 1.0));
          uStack_40 = uStack_230;
          quant = (double)local_238;
          dVar38 = ceil(local_48 * 3.7169221888498387);
          uVar35 = (ulong)dVar38;
          iVar34 = (int)uVar35;
          local_210 = new_ntuple_list(iVar34 * 2 + 1);
          local_220 = (double)(ulong)image->ysize;
          local_d0 = (double)(uVar35 & 0xffffffff);
          uVar36 = SUB84(local_200,0);
          uVar37 = (undefined4)((ulong)local_200 >> 0x20);
          local_c8 = uVar35;
          local_b8 = piVar29;
          local_a8._56_8_ = image;
          if (piVar29->xsize != 0) {
            uVar23 = image->xsize;
            iVar20 = uVar23 * 2;
            local_a8._16_8_ = (undefined8)(long)local_d0;
            uVar33 = iVar20 + (uint)(iVar20 == 0);
            local_178 = CONCAT44(local_178._4_4_,iVar34 + -1);
            dVar38 = 0.0;
            do {
              piVar29 = local_b8;
              local_238 = (rect *)((double)(long)dVar38 / (double)CONCAT44(uVar37,uVar36));
              dVar46 = floor((double)local_238 + 0.5);
              local_198._8_4_ = extraout_XMM0_Dc;
              local_198._0_8_ = dVar46;
              local_198._12_4_ = extraout_XMM0_Dd;
              gaussian_kernel(local_210,local_48,
                              ((double)local_238 + (double)local_a8._16_8_) - (double)(int)dVar46);
              local_a8._48_8_ = ZEXT48(piVar29->ysize);
              if ((image_double)local_a8._48_8_ != (image_double)0x0) {
                local_100 = (int)(double)local_198._0_8_;
                local_238 = (rect *)(ulong)local_210->dim;
                local_a8._32_8_ = local_b8->data;
                local_fc = local_b8->xsize;
                iVar19 = local_100 - (int)local_c8;
                local_e8 = CONCAT44(local_e8._4_4_,iVar19);
                uVar4 = (int)local_c8 - local_100;
                local_a8._24_4_ = uVar4;
                piVar29 = (image_double)0x0;
                do {
                  local_110 = piVar29;
                  if (local_238 == (rect *)0x0) {
                    dVar46 = 0.0;
                  }
                  else {
                    uVar15 = *(uint *)(local_a8._56_8_ + 8);
                    local_208 = *(double **)local_a8._56_8_;
                    local_198._0_4_ = uVar15;
                    iVar5 = (int)local_110 * uVar15;
                    local_218 = (double)CONCAT44(local_218._4_4_,iVar5);
                    local_108 = local_210->values;
                    dVar46 = 0.0;
                    prVar49 = (rect *)0x0;
                    in_R9 = (rect *)(ulong)uVar4;
                    iVar32 = local_100;
                    iVar31 = iVar19;
                    do {
                      iVar13 = 0;
                      if (0 < iVar31) {
                        iVar13 = iVar31;
                      }
                      iVar13 = iVar13 + (int)in_R9;
                      uVar30 = (uint)(iVar13 != 0);
                      uVar14 = iVar13 - uVar30;
                      iVar13 = iVar32;
                      do {
                        iVar13 = iVar13 + uVar23 * -2;
                        iVar25 = ((uVar14 / uVar33 + uVar30) * 2 + 2) * uVar23 + -iVar34 + iVar13;
                      } while (SBORROW4(iVar25,iVar20) == (int)(iVar25 + uVar23 * -2) < 0);
                      iVar25 = -iVar34 + iVar13;
                      iVar6 = ((uVar14 / uVar33 + uVar30) * 2 + 2) * uVar23 + iVar25;
                      if ((int)uVar15 <=
                          (int)(((uVar14 / uVar33 + uVar30) * 2 + 2) * uVar23 + iVar25)) {
                        iVar6 = ((int)local_178 - (uVar14 / uVar33 + uVar30) * iVar20) - iVar13;
                      }
                      dVar46 = dVar46 + local_208[(uint)(iVar6 + iVar5)] * local_108[(long)prVar49];
                      prVar49 = (rect *)((long)&prVar49->x1 + 1);
                      iVar31 = iVar31 + 1;
                      in_R9 = (rect *)(ulong)((int)in_R9 - 1);
                      iVar32 = iVar32 + 1;
                    } while (prVar49 != local_238);
                  }
                  *(double *)
                   (local_a8._32_8_ + (ulong)(local_fc * (int)local_110 + SUB84(dVar38,0)) * 8) =
                       dVar46;
                  piVar29 = (image_double)((long)&local_110->data + 1);
                  local_a8._40_8_ = dVar38;
                } while (piVar29 != (image_double)local_a8._48_8_);
              }
              uVar4 = SUB84(dVar38,0) + 1;
              dVar38 = (double)(ulong)uVar4;
              uVar36 = SUB84(local_200,0);
              uVar37 = (undefined4)((ulong)local_200 >> 0x20);
            } while (uVar4 < local_b8->xsize);
          }
          local_a8._16_4_ = local_c0->ysize;
          if (local_c0->ysize != 0) {
            iVar34 = SUB84(local_220,0);
            iVar20 = iVar34 * 2;
            local_d0 = (double)(long)local_d0;
            uVar23 = iVar20 + (uint)(iVar20 == 0);
            iVar19 = -(int)local_c8;
            local_178 = CONCAT44(local_178._4_4_,(int)local_c8 + -1);
            local_e8 = 0;
            dVar38 = 0.0;
            do {
              local_238 = (rect *)(dVar38 / (double)CONCAT44(uVar37,uVar36));
              local_a8._24_8_ = dVar38;
              dVar38 = floor((double)local_238 + 0.5);
              local_198._8_4_ = extraout_XMM0_Dc_00;
              local_198._0_8_ = dVar38;
              local_198._12_4_ = extraout_XMM0_Dd_00;
              gaussian_kernel(local_210,local_48,
                              ((double)local_238 + local_d0) - (double)(int)dVar38);
              local_110 = (image_double)(ulong)local_c0->xsize;
              if (local_110 != (image_double)0x0) {
                iVar32 = (int)(double)local_198._0_8_;
                local_238 = (rect *)(ulong)local_210->dim;
                local_a8._48_8_ = local_c0->data;
                uVar33 = local_c0->xsize * (int)local_e8;
                local_a8._40_8_ = ZEXT48(uVar33);
                local_fc = iVar32 - (int)local_c8;
                local_a8._32_4_ = iVar32;
                local_100 = (int)local_c8 - iVar32;
                piVar29 = (image_double)0x0;
                do {
                  if (local_238 == (rect *)0x0) {
                    pdVar50 = (double *)0x0;
                  }
                  else {
                    local_198._0_4_ = *(uint *)(local_a8._56_8_ + 0xc);
                    local_208 = local_b8->data;
                    local_218 = (double)CONCAT44(local_218._4_4_,local_b8->xsize);
                    local_108 = local_210->values;
                    pdVar50 = (double *)0x0;
                    in_R9 = (rect *)0x0;
                    iVar31 = iVar32;
                    iVar5 = local_100;
                    uVar4 = local_fc;
                    do {
                      uVar15 = 0;
                      if (0 < (int)uVar4) {
                        uVar15 = uVar4;
                      }
                      uVar14 = (uint)(uVar15 + iVar5 != 0);
                      uVar15 = (uVar15 + iVar5) - uVar14;
                      iVar25 = SUB84(local_220,0);
                      iVar13 = iVar31;
                      do {
                        iVar13 = iVar13 + iVar34 * -2;
                      } while (iVar20 <= (int)(((uVar15 / uVar23 + uVar14) * 2 + 2) * iVar25 +
                                               iVar19 + iVar13));
                      iVar6 = iVar19 + iVar13;
                      iVar7 = ((uVar15 / uVar23 + uVar14) * 2 + 2) * iVar25 + iVar6;
                      if ((int)*(uint *)(local_a8._56_8_ + 0xc) <=
                          (int)(((uVar15 / uVar23 + uVar14) * 2 + 2) * iVar25 + iVar6)) {
                        iVar7 = ((int)local_178 - (uVar15 / uVar23 + uVar14) * iVar20) - iVar13;
                      }
                      pdVar50 = (double *)
                                ((double)pdVar50 +
                                local_208[iVar7 * local_b8->xsize + (int)piVar29] *
                                local_108[(long)in_R9]);
                      in_R9 = (rect *)((long)&in_R9->x1 + 1);
                      uVar4 = uVar4 + 1;
                      iVar5 = iVar5 + -1;
                      iVar31 = iVar31 + 1;
                    } while (in_R9 != local_238);
                  }
                  (&((image_double)local_a8._48_8_)->data)[uVar33 + (int)piVar29] = pdVar50;
                  piVar29 = (image_double)((long)&piVar29->data + 1);
                } while (piVar29 != local_110);
              }
              dVar38 = (double)local_a8._24_8_ + 1.0;
              uVar33 = (int)local_e8 + 1;
              local_e8 = (ulong)uVar33;
              uVar36 = SUB84(local_200,0);
              uVar37 = (undefined4)((ulong)local_200 >> 0x20);
            } while (uVar33 != local_a8._16_4_);
          }
          free_ntuple_list(local_210);
          free_image_double(local_b8);
          piVar29 = local_c0;
          in_RCX = (rect *)local_a8;
          reg_size_00 = (uint *)(ulong)(uint)local_a8._68_4_;
          sigma_scale = (double)local_a8._8_8_;
          piVar8 = ll_angle(local_c0,(double)local_d8,&local_b0,&local_50,(image_double *)in_RCX,
                            local_a8._68_4_,(double)local_a8._8_8_);
          free_image_double(piVar29);
          goto LAB_00104cdb;
        }
      }
      goto LAB_00105ddc;
    }
  }
  LineSegmentDetection();
LAB_00105e13:
  LineSegmentDetection();
LAB_00105e18:
  LineSegmentDetection();
  if ((piVar29 == (image_double)0x0) || (piVar29->data == (double *)0x0)) {
LAB_00106266:
    ll_angle();
    prVar49 = in_RCX;
    plVar27 = plVar26;
    piVar8 = piVar29;
    prVar40 = (rect *)sigma_scale;
LAB_0010626b:
    ll_angle();
LAB_00106270:
    ll_angle();
LAB_00106275:
    ll_angle();
LAB_0010627a:
    ll_angle();
LAB_0010627f:
    ll_angle();
LAB_00106284:
    ll_angle();
  }
  else {
    uVar23 = piVar29->xsize;
    uVar35 = (ulong)uVar23;
    if (uVar35 == 0) goto LAB_00106266;
    uVar33 = piVar29->ysize;
    uVar28 = (ulong)uVar33;
    if (uVar28 == 0) goto LAB_00106266;
    prVar49 = in_RCX;
    plVar27 = plVar26;
    piVar8 = piVar29;
    prVar40 = (rect *)sigma_scale;
    if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 0.0) goto LAB_0010626b;
    if (plVar26 == (long *)0x0) goto LAB_00106270;
    if (extraout_RDX == (undefined8 *)0x0) goto LAB_00106275;
    if (in_RCX == (rect *)0x0) goto LAB_0010627a;
    uVar4 = (uint)reg_size_00;
    piVar10 = (image_double)((ulong)reg_size_00 & 0xffffffff);
    if (uVar4 == 0) goto LAB_0010627f;
    if (sigma_scale <= 0.0) goto LAB_00106284;
    pnVar11 = (ntuple_list)new_image_double(uVar23,uVar33);
    piVar8 = new_image_double(piVar29->xsize,piVar29->ysize);
    in_RCX->x1 = (double)piVar8;
    pvVar12 = calloc((ulong)(uVar33 * uVar23),0x10);
    *extraout_RDX = pvVar12;
    plStackY_308 = (long *)calloc((size_t)piVar10,8);
    plVar27 = (long *)0x8;
    piVar8 = piVar10;
    __s = calloc((size_t)piVar10,8);
    if (((pvVar12 != (void *)0x0) && (plStackY_308 != (long *)0x0)) && (__s != (void *)0x0)) {
      memset(__s,0,(long)piVar10 * 8);
      memset(plStackY_308,0,(long)piVar10 * 8);
      lVar24 = *(long *)pnVar11;
      uVar15 = (uVar33 - 1) * uVar23;
      do {
        *(undefined8 *)(lVar24 + (ulong)uVar15 * 8) = 0xc090000000000000;
        uVar15 = uVar15 + 1;
        uVar35 = uVar35 - 1;
      } while (uVar35 != 0);
      lVar24 = *(long *)pnVar11;
      uVar15 = uVar23 - 1;
      do {
        *(undefined8 *)(lVar24 + (ulong)uVar15 * 8) = 0xc090000000000000;
        uVar15 = uVar15 + uVar23;
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
      if (uVar23 != 1) {
        uStackY_2e8 = 0;
        iVar34 = 0;
        uVar15 = uVar23;
        do {
          iVar20 = (int)uStackY_2e8;
          if (uVar33 != 1) {
            uVar35 = 0;
            uVar14 = uVar15;
            do {
              pdVar50 = piVar29->data;
              dVar46 = (pdVar50[uVar14 + 1] - pdVar50[uStackY_2e8]) +
                       (pdVar50[(int)uStackY_2e8 + 1] - pdVar50[uVar14]);
              dVar39 = (pdVar50[uVar14 + 1] - pdVar50[uStackY_2e8]) -
                       (pdVar50[(int)uStackY_2e8 + 1] - pdVar50[uVar14]);
              dVar38 = (dVar46 * dVar46 + dVar39 * dVar39) * 0.25;
              if (dVar38 < 0.0) {
                dVar38 = sqrt(dVar38);
              }
              else {
                dVar38 = SQRT(dVar38);
              }
              *(double *)(*(long *)in_RCX->x1 + uStackY_2e8 * 8) = dVar38;
              if (dVar38 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) {
                *(undefined8 *)(*(long *)pnVar11 + uStackY_2e8 * 8) = 0xc090000000000000;
              }
              else {
                dVar46 = atan2(dVar46,-dVar39);
                *(double *)(*(long *)pnVar11 + uStackY_2e8 * 8) = dVar46;
                uVar28 = (ulong)((dVar38 * (double)(long)piVar10) / sigma_scale);
                uVar16 = uVar28 & 0xffffffff;
                if (uVar4 <= (uint)uVar28) {
                  uVar16 = (ulong)(uVar4 - 1);
                }
                plVar27 = (long *)((long)__s + uVar16 * 8);
                lVar24 = *(long *)((long)__s + uVar16 * 8);
                pvVar21 = (void *)((long)iVar34 * 0x10 + (long)pvVar12);
                if (lVar24 == 0) {
                  *plVar27 = (long)pvVar21;
                  plVar17 = plStackY_308 + uVar16;
                }
                else {
                  *(void **)(lVar24 + 8) = pvVar21;
                  plVar17 = plVar27;
                }
                *plVar17 = (long)pvVar21;
                iVar34 = iVar34 + 1;
                piVar2 = (int *)*plVar27;
                *piVar2 = iVar20;
                piVar2[1] = (int)uVar35;
                piVar2[2] = 0;
                piVar2[3] = 0;
              }
              uVar35 = uVar35 + 1;
              uVar14 = uVar14 + uVar23;
              uStackY_2e8 = (ulong)((int)uStackY_2e8 + uVar23);
            } while (uVar33 - 1 != uVar35);
          }
          uVar14 = iVar20 + 1;
          uStackY_2e8 = (ulong)uVar14;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar23 - 1);
      }
      do {
        iVar34 = (int)piVar10;
        if (iVar34 == 1) {
          piVar10 = (image_double)0x0;
          iVar20 = 1;
          break;
        }
        piVar10 = (image_double)(ulong)(iVar34 - 1);
        iVar20 = iVar34;
      } while (plStackY_308[(long)piVar10] == 0);
      lVar24 = plStackY_308[(long)piVar10];
      if (iVar20 != 2 && lVar24 != 0) {
        lVar22 = *(long *)((long)__s + (long)piVar10 * 8);
        uVar35 = (ulong)(iVar34 - 2);
        do {
          uVar28 = uVar35 - 1;
          if (plStackY_308[uVar35] != 0) {
            *(long *)(lVar22 + 8) = plStackY_308[uVar35];
            lVar22 = *(long *)((long)__s + uVar28 * 8 + 8);
          }
          uVar35 = uVar28;
        } while ((int)uVar28 != 0);
      }
      *plVar26 = lVar24;
      free(plStackY_308);
      free(__s);
      return pnVar11;
    }
  }
  ll_angle();
  uVar23 = (uint)plVar27;
  uVar33 = (uint)piVar8;
  if ((((int)(uVar23 | uVar33) < 0) || ((int)angles->xsize <= (int)uVar33)) ||
     ((int)angles->ysize <= (int)uVar23)) {
    region_grow();
LAB_001064cb:
    region_grow();
LAB_001064d0:
    region_grow();
LAB_001064d5:
    region_grow();
LAB_001064da:
    region_grow();
  }
  else {
    if ((angles == (image_double)0x0) || (pdVar50 = angles->data, pdVar50 == (double *)0x0))
    goto LAB_001064cb;
    if (prVar49 == (rect *)0x0) goto LAB_001064d5;
    if (reg_size_00 == (uint *)0x0) goto LAB_001064da;
    if (in_R9 != (rect *)0x0) {
      if ((plStackY_308 != (long *)0x0) && (*plStackY_308 != 0)) {
        *reg_size_00 = 1;
        *(uint *)&prVar49->x1 = uVar33;
        *(uint *)((long)&prVar49->x1 + 4) = uVar23;
        dVar38 = pdVar50[angles->xsize * uVar23 + uVar33];
        in_R9->x1 = dVar38;
        dStackY_368 = cos(dVar38);
        dStackY_358 = sin(in_R9->x1);
        pnVar11 = (ntuple_list)*plStackY_308;
        *(undefined1 *)((long)&pnVar11->size + (ulong)(uVar23 * (int)plStackY_308[1] + uVar33)) = 1;
        if (0 < (int)*reg_size_00) {
          lVar24 = 0;
          do {
            uVar23 = *(int *)(&prVar49->x1 + lVar24) - 1;
            do {
              uVar33 = *(int *)((long)&prVar49->x1 + lVar24 * 8 + 4) - 2;
              do {
                uVar33 = uVar33 + 1;
                if ((((-1 < (int)(uVar33 | uVar23)) && ((int)uVar23 < (int)plStackY_308[1])) &&
                    ((int)uVar33 < *(int *)((long)plStackY_308 + 0xc))) &&
                   ((*(char *)(*plStackY_308 + (ulong)((int)plStackY_308[1] * uVar33 + uVar23)) !=
                     '\x01' &&
                    (iVar34 = isaligned(uVar23,uVar33,angles,in_R9->x1,
                                        (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)),
                    iVar34 != 0)))) {
                  *(undefined1 *)(*plStackY_308 + (ulong)((int)plStackY_308[1] * uVar33 + uVar23)) =
                       1;
                  *(uint *)(&prVar49->x1 + (int)*reg_size_00) = uVar23;
                  *(uint *)((long)&prVar49->x1 + (long)(int)*reg_size_00 * 8 + 4) = uVar33;
                  *reg_size_00 = *reg_size_00 + 1;
                  dVar38 = cos(angles->data[angles->xsize * uVar33 + uVar23]);
                  dStackY_368 = dStackY_368 + dVar38;
                  dVar38 = sin(angles->data[angles->xsize * uVar33 + uVar23]);
                  dStackY_358 = dStackY_358 + dVar38;
                  dVar38 = atan2(dStackY_358,dStackY_368);
                  in_R9->x1 = dVar38;
                }
              } while ((int)uVar33 <= *(int *)((long)&prVar49->x1 + lVar24 * 8 + 4));
              bVar3 = (int)uVar23 <= *(int *)(&prVar49->x1 + lVar24);
              uVar23 = uVar23 + 1;
            } while (bVar3);
            lVar24 = lVar24 + 1;
            pnVar11 = (ntuple_list)(long)(int)*reg_size_00;
          } while (lVar24 < (long)pnVar11);
        }
        return pnVar11;
      }
      goto LAB_001064d0;
    }
  }
  region_grow();
  piVar29 = piVar8;
  if (piVar8 == (image_double)0x0) {
LAB_001069cc:
    region2rect();
LAB_001069d1:
    region2rect();
LAB_001069d6:
    region2rect();
LAB_001069db:
    region2rect();
  }
  else {
    iVar34 = (int)plVar27;
    if (iVar34 < 2) goto LAB_001069d1;
    if ((extraout_RDX_00 == (long *)0x0) || (lVar24 = *extraout_RDX_00, lVar24 == 0)) {
      region2rect();
      piVar29 = piVar8;
LAB_001069c7:
      region2rect();
      goto LAB_001069cc;
    }
    if (prVar49 == (rect *)0x0) goto LAB_001069d6;
    dVar38 = 0.0;
    piVar29 = (image_double)0x0;
    dVar46 = 0.0;
    dVar39 = 0.0;
    do {
      iVar20 = *(int *)((long)&piVar8->data + (long)piVar29 * 8 + 4);
      dVar52 = *(double *)
                (lVar24 + (ulong)(uint)((int)extraout_RDX_00[1] * iVar20 +
                                       *(int *)(&piVar8->data + (long)piVar29)) * 8);
      dVar46 = dVar46 + (double)*(int *)(&piVar8->data + (long)piVar29) * dVar52;
      dVar39 = dVar39 + (double)iVar20 * dVar52;
      dVar38 = dVar38 + dVar52;
      piVar29 = (image_double)((long)&piVar29->data + 1);
    } while ((image_double)((ulong)plVar27 & 0xffffffff) != piVar29);
    if (dVar38 <= 0.0) goto LAB_001069db;
    if (1 < iVar34) {
      dVar52 = 0.0;
      if ((double)prVar40 < 0.0) goto LAB_001069e5;
      dVar46 = dVar46 / dVar38;
      dVar39 = dVar39 / dVar38;
      piVar29 = (image_double)0x0;
      dVar38 = 0.0;
      dVar53 = 0.0;
      do {
        uVar23 = *(uint *)(&piVar8->data + (long)piVar29);
        iVar20 = *(int *)((long)&piVar8->data + (long)piVar29 * 8 + 4);
        dVar1 = *(double *)(lVar24 + (ulong)(iVar20 * (int)extraout_RDX_00[1] + uVar23) * 8);
        dVar41 = (double)iVar20 - dVar39;
        dVar53 = dVar53 + dVar41 * dVar41 * dVar1;
        dVar42 = (double)(int)uVar23 - dVar46;
        dVar38 = dVar38 + dVar42 * dVar42 * dVar1;
        dVar52 = dVar52 - dVar41 * dVar42 * dVar1;
        piVar29 = (image_double)((long)&piVar29->data + 1);
      } while ((image_double)((ulong)plVar27 & 0xffffffff) != piVar29);
      if ((dVar53 != 0.0) || (NAN(dVar53))) {
        dVar41 = ABS(dVar53);
        dVar1 = dVar41;
        if (dVar41 <= 0.0) {
          dVar1 = 0.0;
        }
        uVar36 = 0;
        uVar37 = 0x100000;
        if (2.2250738585072014e-308 <= dVar1) {
          uVar36 = SUB84(dVar1,0);
          uVar37 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        if (2.220446049250313e-14 < dVar41 / (double)CONCAT44(uVar37,uVar36)) goto LAB_001066f2;
      }
      if ((dVar38 != 0.0) || (NAN(dVar38))) {
        dVar1 = ABS(dVar38);
        dVar41 = dVar1;
        if (dVar1 <= 0.0) {
          dVar41 = 0.0;
        }
        dVar42 = 2.2250738585072014e-308;
        if (2.2250738585072014e-308 <= dVar41) {
          dVar42 = dVar41;
        }
        if (2.220446049250313e-14 < dVar1 / dVar42) goto LAB_001066f2;
      }
      piVar29 = (image_double)(ulong)uVar23;
      if ((dVar52 != 0.0) || (NAN(dVar52))) {
        dVar41 = ABS(dVar52);
        dVar1 = dVar41;
        if (dVar41 <= 0.0) {
          dVar1 = 0.0;
        }
        dVar42 = 2.2250738585072014e-308;
        if (2.2250738585072014e-308 <= dVar1) {
          dVar42 = dVar1;
        }
        if (2.220446049250313e-14 < dVar41 / dVar42) {
LAB_001066f2:
          dVar1 = (dVar53 - dVar38) * (dVar53 - dVar38) + dVar52 * 4.0 * dVar52;
          if (dVar1 < 0.0) {
            dVar1 = sqrt(dVar1);
          }
          else {
            dVar1 = SQRT(dVar1);
          }
          dVar1 = ((dVar38 + dVar53) - dVar1) * 0.5;
          if (ABS(dVar53) <= ABS(dVar38)) {
            dVar38 = dVar1 - dVar38;
          }
          else {
            dVar38 = dVar52;
            dVar52 = dVar1 - dVar53;
          }
          dVar38 = atan2(dVar52,dVar38);
          for (dVar52 = dVar38 - (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
              dVar52 <= -3.141592653589793; dVar52 = dVar52 + 6.28318530718) {
          }
          for (; 3.141592653589793 < dVar52; dVar52 = dVar52 + -6.28318530718) {
          }
          dVar53 = -dVar52;
          if (-dVar52 <= dVar52) {
            dVar53 = dVar52;
          }
          dVar53 = (double)(~-(ulong)((double)prVar40 < dVar53) & (ulong)dVar38 |
                           (ulong)(dVar38 + 3.141592653589793) & -(ulong)((double)prVar40 < dVar53))
          ;
          dVar38 = cos(dVar53);
          dVar52 = sin(dVar53);
          pnVar11 = (ntuple_list)0x1;
          if (1 < iVar34) {
            pnVar11 = (ntuple_list)((ulong)plVar27 & 0xffffffff);
          }
          pnVar18 = (ntuple_list)0x0;
          dVar41 = 0.0;
          dVar1 = 0.0;
          dVar42 = 0.0;
          dVar47 = 0.0;
          do {
            dVar44 = (double)*(int *)(&piVar8->data + (long)pnVar18) - dVar46;
            dVar43 = (double)*(int *)((long)&piVar8->data + (long)pnVar18 * 8 + 4) - dVar39;
            dVar48 = dVar44 * dVar38 + dVar52 * dVar43;
            dVar44 = dVar43 * dVar38 - dVar44 * dVar52;
            dVar43 = dVar48;
            if (dVar48 <= dVar1) {
              dVar43 = dVar1;
            }
            if (dVar47 <= dVar48) {
              dVar48 = dVar47;
            }
            dVar45 = dVar44;
            if (dVar44 <= dVar41) {
              dVar45 = dVar41;
            }
            if (dVar42 <= dVar44) {
              dVar44 = dVar42;
            }
            pnVar18 = (ntuple_list)((long)&pnVar18->size + 1);
            dVar41 = dVar45;
            dVar1 = dVar43;
            dVar42 = dVar44;
            dVar47 = dVar48;
          } while (pnVar11 != pnVar18);
          prVar49->x1 = dVar48 * dVar38 + dVar46;
          prVar49->y1 = dVar48 * dVar52 + dVar39;
          prVar49->x2 = dVar38 * dVar43 + dVar46;
          prVar49->y2 = dVar43 * dVar52 + dVar39;
          prVar49->width = dVar45 - dVar44;
          prVar49->x = dVar46;
          prVar49->y = dVar39;
          prVar49->theta = dVar53;
          prVar49->dx = dVar38;
          prVar49->dy = dVar52;
          prVar49->prec = (double)prVar40;
          prVar49->p = quant;
          if (dVar45 - dVar44 < 1.0) {
            pnVar11 = (ntuple_list)0x3ff0000000000000;
            prVar49->width = 1.0;
          }
          return pnVar11;
        }
      }
      goto LAB_001069c7;
    }
  }
  region2rect();
LAB_001069e5:
  region2rect();
  pnVar11 = LineSegmentDetection
                      (piVar29,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02),0.6,2.0,
                       22.5,0.0,0.7,0x400,255.0,(image_int *)0x0);
  return pnVar11;
}

Assistant:

ntuple_list LineSegmentDetection( image_double image, double scale,
                                  double sigma_scale, double quant,
                                  double ang_th, double eps, double density_th,
                                  int n_bins, double max_grad,
                                  image_int *region )
{
    ntuple_list out = new_ntuple_list(5);
    image_double scaled_image, angles, modgrad;
    image_char used;
    struct coorlist *list_p;
    void *mem_p;
    struct rect rec;
    struct point *reg;
    int reg_size, min_reg_size, i;
    unsigned int xsize, ysize;
    double rho, reg_angle, prec, p, log_nfa, logNT;
    int ls_count = 0;                   /* line segments are numbered 1,2,3,... */


    /* check parameters */
    if ( image == NULL || image->data == NULL || image->xsize == 0 || image->ysize == 0 )
        error("invalid image input.");
    if ( scale <= 0.0 ) error("'scale' value must be positive.");
    if ( sigma_scale <= 0.0 ) error("'sigma_scale' value must be positive.");
    if ( quant < 0.0 ) error("'quant' value must be positive.");
    if ( ang_th <= 0.0 || ang_th >= 180.0 )
        error("'ang_th' value must be in the range (0,180).");
    if ( density_th < 0.0 || density_th > 1.0 )
        error("'density_th' value must be in the range [0,1].");
    if ( n_bins <= 0 ) error("'n_bins' value must be positive.");
    if ( max_grad <= 0.0 ) error("'max_grad' value must be positive.");


    /* angle tolerance */
    prec = M_PI * ang_th / 180.0;
    p = ang_th / 180.0;
    rho = quant / sin(prec); /* gradient magnitude threshold */


    /* scale image (if necessary) and compute angle at each pixel */
    if ( scale != 1.0 )
    {
        scaled_image = gaussian_sampler( image, scale, sigma_scale );
        angles = ll_angle( scaled_image, rho, &list_p, &mem_p,
                           &modgrad, (unsigned int) n_bins, max_grad );
        free_image_double(scaled_image);
    }
    else
        angles = ll_angle( image, rho, &list_p, &mem_p, &modgrad,
                           (unsigned int) n_bins, max_grad );
    xsize = angles->xsize;
    ysize = angles->ysize;
    logNT = 5.0 * ( log10( (double) xsize ) + log10( (double) ysize ) ) / 2.0;
    min_reg_size = (int) (-logNT / log10(p)); /* minimal number of points in region
                                             that can give a meaningful event */


    /* initialize some structures */
    if ( region != NULL ) /* image to output pixel region number, if asked */
        *region = new_image_int_ini(angles->xsize, angles->ysize, 0);
    used = new_image_char_ini(xsize, ysize, NOTUSED);
    reg = (struct point *) calloc( (size_t) (xsize * ysize), sizeof(struct point) );
    if ( reg == NULL ) error("not enough memory!");


    /* search for line segments */
    for (; list_p != NULL; list_p = list_p->next )
        if ( used->data[ list_p->x + list_p->y * used->xsize ] == NOTUSED &&
                angles->data[ list_p->x + list_p->y * angles->xsize ] != NOTDEF )
            /* there is no risk of double comparison problems here
               because we are only interested in the exact NOTDEF value */
        {
            /* find the region of connected point and ~equal angle */
            region_grow( list_p->x, list_p->y, angles, reg, &reg_size,
                         &reg_angle, used, prec );

            /* reject small regions */
            if ( reg_size < min_reg_size ) continue;

            /* construct rectangular approximation for the region */
            region2rect(reg, reg_size, modgrad, reg_angle, prec, p, &rec);

            /* Check if the rectangle exceeds the minimal density of
               region points. If not, try to improve the region.
               The rectangle will be rejected if the final one does
               not fulfill the minimal density condition.
               This is an addition to the original LSD algorithm published in
               "LSD: A Fast Line Segment Detector with a False Detection Control"
               by R. Grompone von Gioi, J. Jakubowicz, J.M. Morel, and G. Randall.
               The original algorithm is obtained with density_th = 0.0.
             */
            if ( !refine( reg, &reg_size, modgrad, reg_angle,
                          prec, p, &rec, used, angles, density_th ) ) continue;

            /* compute NFA value */
            log_nfa = rect_improve(&rec, angles, logNT, eps);
            if ( log_nfa <= eps ) continue;

            /* A New Line Segment was found! */
            ++ls_count;  /* increase line segment counter */

            /*
               The gradient was computed with a 2x2 mask, its value corresponds to
               points with an offset of (0.5,0.5), that should be added to output.
               The coordinates origin is at the center of pixel (0,0).
             */
            rec.x1 += 0.5; rec.y1 += 0.5;
            rec.x2 += 0.5; rec.y2 += 0.5;

            /* scale the result values if a subsampling was performed */
            if ( scale != 1.0 )
            {
                rec.x1 /= scale; rec.y1 /= scale;
                rec.x2 /= scale; rec.y2 /= scale;
                rec.width /= scale;
            }

            /* add line segment found to output */
            add_5tuple(out, rec.x1, rec.y1, rec.x2, rec.y2, rec.width);

            /* add region number to 'region' image if needed */
            if ( region != NULL )
                for (i = 0; i < reg_size; i++)
                    (*region)->data[reg[i].x + reg[i].y * (*region)->xsize] = ls_count;
        }


    /* free memory */
    free_image_double(angles);
    free_image_double(modgrad);
    free_image_char(used);
    free( (void *) reg );
    free( (void *) mem_p );

    return out;
}